

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test_driver.cc
# Opt level: O0

bool libaom_test::compare_plane
               (uint8_t *buf1,int stride1,uint8_t *buf2,int stride2,int w,int h,int *mismatch_row,
               int *mismatch_col,int *mismatch_pix1,int *mismatch_pix2)

{
  byte bVar1;
  byte bVar2;
  int pix2;
  int pix1;
  int c;
  int r;
  int h_local;
  int w_local;
  int stride2_local;
  uint8_t *buf2_local;
  int stride1_local;
  uint8_t *buf1_local;
  
  r = 0;
  do {
    if (h <= r) {
      return true;
    }
    for (c = 0; c < w; c = c + 1) {
      bVar1 = buf1[r * stride1 + c];
      bVar2 = buf2[r * stride2 + c];
      if ((uint)bVar1 != (uint)bVar2) {
        if (mismatch_row != (int *)0x0) {
          *mismatch_row = r;
        }
        if (mismatch_col != (int *)0x0) {
          *mismatch_col = c;
        }
        if (mismatch_pix1 != (int *)0x0) {
          *mismatch_pix1 = (uint)bVar1;
        }
        if (mismatch_pix2 != (int *)0x0) {
          *mismatch_pix2 = (uint)bVar2;
        }
        return false;
      }
    }
    r = r + 1;
  } while( true );
}

Assistant:

static bool compare_plane(const uint8_t *const buf1, int stride1,
                          const uint8_t *const buf2, int stride2, int w, int h,
                          int *const mismatch_row, int *const mismatch_col,
                          int *const mismatch_pix1, int *const mismatch_pix2) {
  int r, c;

  for (r = 0; r < h; ++r) {
    for (c = 0; c < w; ++c) {
      const int pix1 = buf1[r * stride1 + c];
      const int pix2 = buf2[r * stride2 + c];

      if (pix1 != pix2) {
        if (mismatch_row != nullptr) *mismatch_row = r;
        if (mismatch_col != nullptr) *mismatch_col = c;
        if (mismatch_pix1 != nullptr) *mismatch_pix1 = pix1;
        if (mismatch_pix2 != nullptr) *mismatch_pix2 = pix2;
        return false;
      }
    }
  }

  return true;
}